

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_copy_comp2img(fitsfile *infptr,fitsfile *outfptr,int norec,int *status)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  char negative [2];
  int nmore;
  int tstatus;
  int nkeys;
  char card [81];
  char *pcStack_2c0;
  char *patterns [40] [2];
  
  tstatus = 0;
  negative[0] = '-';
  negative[1] = '\0';
  iVar2 = *status;
  if (iVar2 < 1) {
    for (lVar3 = 8; lVar3 != 0xb8; lVar3 = lVar3 + 0x10) {
      *(undefined8 *)((long)&pcStack_2c0 + lVar3) = *(undefined8 *)(&UNK_002573d8 + lVar3);
      pcVar5 = negative;
      if (norec == 0) {
        pcVar5 = *(char **)((long)&PTR_anon_var_dwarf_694ba_002573e0 + lVar3);
      }
      *(char **)((long)patterns[0] + lVar3) = pcVar5;
    }
    for (lVar3 = 0; lVar3 != 0x160; lVar3 = lVar3 + 0x10) {
      uVar1 = *(undefined8 *)(&UNK_00257498 + lVar3);
      *(undefined8 *)((long)patterns[0xb] + lVar3) = *(undefined8 *)(&DAT_00257490 + lVar3);
      *(undefined8 *)((long)patterns[0xb] + lVar3 + 8) = uVar1;
    }
    ffgcrd(infptr,"EXTNAME",card,&tstatus);
    if (tstatus == 0) {
      iVar2 = bcmp(card,"EXTNAME = \'COMPRESSED_IMAGE\'",0x1c);
      if (iVar2 == 0) {
        patterns[0x1f][1] = negative;
      }
    }
    fits_translate_keywords(infptr,outfptr,1,patterns,0x21,0,0,0,status);
    ffghsp(infptr,&nkeys,&nmore,status);
    uVar4 = (long)nmore / 0x24 & 0xffffffff;
    nmore = (int)((long)nmore / 0x24);
    for (iVar2 = 0; iVar2 < (int)uVar4; iVar2 = iVar2 + 1) {
      iVar6 = 0x24;
      while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
        ffprec(outfptr,"    ",status);
      }
      uVar4 = (ulong)(uint)nmore;
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int imcomp_copy_comp2img(fitsfile *infptr, fitsfile *outfptr, 
                          int norec, int *status)
/*
    This routine copies the header keywords from the compressed input image 
    and to the uncompressed image (in a binary table) 
*/
{
    char card[FLEN_CARD];	/* a header record */
    char *patterns[40][2];
    char negative[] = "-";
    int ii,jj, npat, nreq, nsp, tstatus = 0;
    int nkeys, nmore;
    
    /* tile compressed image keyword translation table  */
    /*                        INPUT      OUTPUT  */
    /*                       01234567   01234567 */

    /*  only translate these if required keywords not already written */
    char *reqkeys[][2] = {  
			   {"ZSIMPLE",   "SIMPLE" },  
			   {"ZTENSION", "XTENSION"},
			   {"ZBITPIX",   "BITPIX" },
			   {"ZNAXIS",    "NAXIS"  },
			   {"ZNAXISm",   "NAXISm" },
			   {"ZEXTEND",   "EXTEND" },
			   {"ZBLOCKED",  "BLOCKED"},
			   {"ZPCOUNT",   "PCOUNT" },  
			   {"ZGCOUNT",   "GCOUNT" },
			   {"ZHECKSUM",  "CHECKSUM"},  /* restore original checksums */
			   {"ZDATASUM",  "DATASUM"}}; 

    /* other special keywords */
    char *spkeys[][2] = {
			   {"XTENSION", "-"      },
			   {"BITPIX",  "-"       },
			   {"NAXIS",   "-"       },
			   {"NAXISm",  "-"       },
			   {"PCOUNT",  "-"       },
			   {"GCOUNT",  "-"       },
			   {"TFIELDS", "-"       },
			   {"TTYPEm",  "-"       },
			   {"TFORMm",  "-"       },
			   {"THEAP",   "-"       },
			   {"ZIMAGE",  "-"       },
			   {"ZQUANTIZ", "-"      },
			   {"ZDITHER0", "-"      },
			   {"ZTILEm",  "-"       },
			   {"ZCMPTYPE", "-"      },
			   {"ZBLANK",  "-"       },
			   {"ZNAMEm",  "-"       },
			   {"ZVALm",   "-"       },

			   {"CHECKSUM","-"       },  /* delete checksums */
			   {"DATASUM", "-"       },
			   {"EXTNAME", "+"       },  /* we may change this, below */
			   {"*",       "+"      }};  


    if (*status > 0)
        return(*status);
	
    nreq = sizeof(reqkeys)/sizeof(reqkeys[0][0])/2;
    nsp = sizeof(spkeys)/sizeof(spkeys[0][0])/2;

    /* construct translation patterns */

    for (ii = 0; ii < nreq; ii++) {
        patterns[ii][0] = reqkeys[ii][0];
	
        if (norec) 
            patterns[ii][1] = negative;
        else
            patterns[ii][1] = reqkeys[ii][1];
    }
    
    for (ii = 0; ii < nsp; ii++) {
        patterns[ii+nreq][0] = spkeys[ii][0];
        patterns[ii+nreq][1] = spkeys[ii][1];
    }

    npat = nreq + nsp;
    
    /* see if the EXTNAME keyword should be copied or not */
    fits_read_card(infptr, "EXTNAME", card, &tstatus);

    if (tstatus == 0) {
      if (!strncmp(card, "EXTNAME = 'COMPRESSED_IMAGE'", 28)) 
        patterns[npat-2][1] = negative;
    }
    
    /* translate and copy the keywords from the input file to the output */
    fits_translate_keywords(infptr, outfptr, 1, patterns, npat,
			    0, 0, 0, status);

    ffghsp(infptr, &nkeys, &nmore, status); /* get number of keywords in image */

    nmore = nmore / 36;  /* how many completely empty header blocks are there? */
     
    /* preserve the same number of spare header blocks in the output header */
     
    for (jj = 0; jj < nmore; jj++)
       for (ii = 0; ii < 36; ii++)
          fits_write_record(outfptr, "    ", status);


    return (*status);
}